

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

float rr::anon_unknown_19::findTriangleVertexDepthSlope(Vec4 *p,Vec4 *v0,Vec4 *v1)

{
  float afVar1 [2];
  int i;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec2 dxDir;
  Vec2 dyDir;
  Vec3 b;
  Vec3 a;
  float local_8 [2];
  
  dyDir.m_data = *(float (*) [2])p->m_data;
  afVar1 = *(float (*) [2])v1->m_data;
  b.m_data._0_8_ = *(undefined8 *)v0->m_data;
  b.m_data[2] = v0->m_data[2];
  dxDir.m_data = *(float (*) [2])p->m_data;
  a.m_data[0] = 0.0;
  a.m_data[1] = 0.0;
  a.m_data[2] = 0.0;
  lVar2 = 0;
  do {
    a.m_data[lVar2] = b.m_data[lVar2] - dxDir.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dxDir.m_data = afVar1;
  b.m_data[0] = 0.0;
  b.m_data[1] = 0.0;
  b.m_data[2] = 0.0;
  lVar2 = 0;
  do {
    b.m_data[lVar2] = dxDir.m_data[lVar2] - dyDir.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  fVar4 = a.m_data[0] * b.m_data[1] - a.m_data[1] * b.m_data[0];
  fVar5 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar5 = fVar4;
  }
  fVar3 = 0.0;
  if (0.0001 <= fVar5) {
    dyDir.m_data = (float  [2])(CONCAT44(a.m_data[1],b.m_data[1]) ^ 0x8000000000000000);
    dxDir.m_data[0] = 0.0;
    dxDir.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      dxDir.m_data[lVar2] = dyDir.m_data[lVar2] / fVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    local_8[0] = -b.m_data[0];
    local_8[1] = a.m_data[0];
    dyDir.m_data[0] = 0.0;
    dyDir.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      dyDir.m_data[lVar2] = local_8[lVar2] / fVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    fVar3 = dxDir.m_data[0] * a.m_data[2] + dxDir.m_data[1] * b.m_data[2];
    fVar4 = a.m_data[2] * dyDir.m_data[0] + b.m_data[2] * dyDir.m_data[1];
    fVar5 = -fVar3;
    if (-fVar3 <= fVar3) {
      fVar5 = fVar3;
    }
    fVar3 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar3 = fVar4;
    }
    fVar3 = (float)(~-(uint)(fVar3 <= fVar5) & (uint)fVar3 | (uint)fVar5 & -(uint)(fVar3 <= fVar5));
  }
  return fVar3;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }